

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  size_type sVar2;
  ulong uVar3;
  reference pvVar4;
  long lVar5;
  char *pcVar6;
  ostream *poVar7;
  bool bVar8;
  project proj;
  stat info;
  string arg;
  int i;
  string outputpath;
  string inputpath;
  bool verbose;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  char *in_stack_fffffffffffff908;
  project *in_stack_fffffffffffff910;
  ostream *in_stack_fffffffffffff920;
  allocator_type *in_stack_fffffffffffff938;
  char **in_stack_fffffffffffff940;
  allocator *paVar9;
  char **in_stack_fffffffffffff948;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff950;
  undefined6 in_stack_fffffffffffff988;
  undefined1 in_stack_fffffffffffff98e;
  undefined1 in_stack_fffffffffffff98f;
  string local_630 [32];
  string local_610 [39];
  allocator local_5e9;
  string local_5e8 [648];
  project *in_stack_fffffffffffffca0;
  project *in_stack_fffffffffffffd90;
  stat local_148;
  int local_b4;
  string local_b0 [32];
  int local_90;
  allocator local_89;
  string local_88 [39];
  allocator local_61;
  string local_60 [16];
  string *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  int local_4;
  
  local_4 = 0;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x1067b1);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::vector<char**,void>
            (in_stack_fffffffffffff950,in_stack_fffffffffffff948,in_stack_fffffffffffff940,
             in_stack_fffffffffffff938);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x1067e5);
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&local_28);
  if (sVar2 != 0) {
    in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffc0 & 0xffffff;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"",&local_61);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"",&local_89);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    local_90 = 0;
    do {
      uVar3 = (ulong)local_90;
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_28);
      bVar8 = false;
      if (uVar3 < sVar2) {
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&local_28,(long)local_90);
        lVar5 = std::__cxx11::string::rfind((char *)pvVar4,0x149004);
        bVar8 = lVar5 == 0;
      }
      if (!bVar8) break;
      sVar2 = (size_type)local_90;
      local_90 = local_90 + 1;
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&local_28,sVar2);
      std::__cxx11::string::string(local_b0,(string *)pvVar4);
      in_stack_fffffffffffff98f =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff910,in_stack_fffffffffffff908);
      if ((bool)in_stack_fffffffffffff98f) {
        in_stack_ffffffffffffffc0 = CONCAT13(1,(int3)in_stack_ffffffffffffffc0);
LAB_00106bb8:
        local_b4 = 0;
      }
      else {
        in_stack_fffffffffffff98e =
             std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff910,in_stack_fffffffffffff908);
        if ((bool)in_stack_fffffffffffff98e) {
          uVar3 = (ulong)local_90;
          sVar2 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(&local_28);
          if (uVar3 < sVar2) {
            sVar2 = (size_type)local_90;
            local_90 = local_90 + 1;
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](&local_28,sVar2);
            std::__cxx11::string::operator=(local_60,(string *)pvVar4);
          }
          else {
            poVar7 = std::operator<<((ostream *)&std::cerr,"-i requires a file path");
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          }
          goto LAB_00106bb8;
        }
        bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff910,in_stack_fffffffffffff908);
        if (!bVar8) goto LAB_00106bb8;
        uVar3 = (ulong)local_90;
        sVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&local_28);
        if (sVar2 <= uVar3) {
          poVar7 = std::operator<<((ostream *)&std::cerr,"-o requires a path");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          goto LAB_00106bb8;
        }
        sVar2 = (size_type)local_90;
        local_90 = local_90 + 1;
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&local_28,sVar2);
        std::__cxx11::string::operator=(local_88,(string *)pvVar4);
        local_b4 = 3;
      }
      std::__cxx11::string::~string(local_b0);
    } while (local_b4 == 0);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      pcVar6 = (char *)std::__cxx11::string::c_str();
      iVar1 = stat(pcVar6,&local_148);
      if (iVar1 == 0) {
        poVar7 = std::operator<<((ostream *)&std::cout,"Opening \"");
        poVar7 = std::operator<<(poVar7,local_60);
        poVar7 = std::operator<<(poVar7,"\"");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        paVar9 = &local_5e9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_5e8,pcVar6,paVar9);
        std::__cxx11::string::string(local_610,local_88);
        project::project((project *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
        std::__cxx11::string::~string(local_610);
        std::__cxx11::string::~string(local_5e8);
        std::allocator<char>::~allocator((allocator<char> *)&local_5e9);
        project::gen_cmake(in_stack_fffffffffffffca0);
        if ((in_stack_ffffffffffffffc0 & 0x1000000) != 0) {
          project::print(in_stack_fffffffffffffd90);
        }
        poVar7 = std::operator<<((ostream *)&std::cout,"Created \"");
        project::get_cmake_file_abi_cxx11_
                  ((project *)
                   CONCAT17(in_stack_fffffffffffff98f,
                            CONCAT16(in_stack_fffffffffffff98e,in_stack_fffffffffffff988)));
        poVar7 = std::operator<<(poVar7,local_630);
        in_stack_fffffffffffff920 = std::operator<<(poVar7,"\"");
        std::ostream::operator<<(in_stack_fffffffffffff920,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_630);
        project::~project(in_stack_fffffffffffff910);
      }
      else {
        poVar7 = std::operator<<((ostream *)&std::cerr,"In-Valid file: ");
        poVar7 = std::operator<<(poVar7,local_60);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      }
    }
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_60);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff920);
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{
    std::vector<std::string> args(argv + 1, argv + argc);

    if (args.size() != 0)
    {
        bool verbose = false;
        std::string inputpath = "";
        std::string outputpath = "";

        int i = 0;
        while (i < args.size() && (args[i].rfind("-", 0) == 0))
        {
            std::string arg = args[i++];
            if (arg == "-v")
            {
                verbose = true;
            }
            else if (arg == "-i")
            {
                if (i < args.size())
                {
                    inputpath = args[i++];
                }
                else
                {
                    std::cerr << "-i requires a file path" << std::endl;
                }
            }
            else if (arg == "-o")
            {
                if (i < args.size())
                {
                    outputpath = args[i++];
                    break;
                }
                else
                {
                    std::cerr << "-o requires a path" << std::endl;
                }
            }
        }

        if(!inputpath.empty())
        {
            struct stat info;
            if( stat( inputpath.c_str(), &info ) == 0 )
            {
                std::cout << "Opening \"" << inputpath << "\"" << std::endl;
                auto proj = project(inputpath.c_str(), outputpath);
                proj.gen_cmake();
                if(verbose)
                {
                    proj.print();
                }
                std::cout << "Created \"" << proj.get_cmake_file() << "\"" << std::endl;
            }
            else
            {
                std::cerr << "In-Valid file: " << inputpath << std::endl;
            }
        }
    }
}